

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O0

void pzshape::TPZShapeTetra::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  long lVar1;
  TPZVec<long> *this;
  int iVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  int *piVar6;
  long *plVar7;
  TPZGenMatrix<int> *in_RCX;
  int in_EDX;
  TPZVec<long> *in_RSI;
  int in_EDI;
  int soma;
  int c;
  int b;
  int a;
  int k;
  int j;
  int i_1;
  int ord;
  int count;
  int nshape_2;
  int i;
  int sum;
  int totsum;
  int il;
  TPZGenMatrix<int> locshapeorders;
  int node;
  TPZManVector<long,_4> locid;
  int nnodes;
  TPZStack<int,_10> lowersides;
  int nshape_1;
  int ioy;
  int nshape;
  size_t in_stack_00000258;
  char *in_stack_00000260;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  TPZStack<int,_10> *in_stack_fffffffffffffe50;
  TPZGenMatrix<int> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  TPZVec<long> *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  int local_110;
  int local_10c;
  int local_108;
  int local_f8;
  int local_f0;
  int local_ec;
  int local_cc;
  TPZVec<long> local_c8 [2];
  int local_88;
  int local_2c;
  int local_28;
  int local_24;
  int local_14;
  TPZVec<long> *local_10;
  int local_4;
  
  if (in_EDI < 4) {
    iVar5 = TPZGenMatrix<int>::Rows(in_RCX);
    if (iVar5 != 1) {
      pzinternal::DebugStopImpl(in_stack_00000260,in_stack_00000258);
    }
    piVar6 = TPZGenMatrix<int>::operator()
                       ((TPZGenMatrix<int> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    *piVar6 = 1;
    piVar6 = TPZGenMatrix<int>::operator()
                       ((TPZGenMatrix<int> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    *piVar6 = 0;
    piVar6 = TPZGenMatrix<int>::operator()
                       ((TPZGenMatrix<int> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    *piVar6 = 0;
  }
  else {
    local_14 = in_EDX;
    if ((in_EDI < 4) || (9 < in_EDI)) {
      if ((in_EDI < 10) || (0xd < in_EDI)) {
        local_f0 = 0;
        for (local_f8 = 0; local_f8 < in_EDX + -3; local_f8 = local_f8 + 1) {
          local_f0 = ((local_f8 + 1) * (local_f8 + 2)) / 2 + local_f0;
        }
        iVar5 = TPZGenMatrix<int>::Rows(in_RCX);
        if (iVar5 != local_f0) {
          pzinternal::DebugStopImpl(in_stack_00000260,in_stack_00000258);
        }
        iVar2 = local_14 + -3;
        for (local_108 = 0; local_108 < iVar2; local_108 = local_108 + 1) {
          for (local_10c = 0; local_10c < iVar2; local_10c = local_10c + 1) {
            for (local_110 = 0; local_110 < iVar2; local_110 = local_110 + 1) {
              iVar3 = local_108 + local_10c + local_110;
              if (iVar3 < iVar2) {
                iVar4 = iVar3 + 4;
                piVar6 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)
                                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                    CONCAT44(in_stack_fffffffffffffe44,iVar4),
                                    CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
                *piVar6 = iVar4;
                in_stack_fffffffffffffe44 = iVar3 + 4;
                piVar6 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)
                                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                    CONCAT44(in_stack_fffffffffffffe44,iVar4),
                                    CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
                *piVar6 = in_stack_fffffffffffffe44;
                in_stack_fffffffffffffe48 = iVar3 + 4;
                piVar6 = TPZGenMatrix<int>::operator()
                                   ((TPZGenMatrix<int> *)
                                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                    CONCAT44(in_stack_fffffffffffffe44,iVar4),
                                    CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
                *piVar6 = in_stack_fffffffffffffe48;
              }
            }
          }
        }
      }
      else {
        local_2c = ((in_EDX + -2) * (in_EDX + -1)) / 2;
        local_10 = in_RSI;
        local_4 = in_EDI;
        iVar5 = TPZGenMatrix<int>::Rows(in_RCX);
        if (iVar5 != local_2c) {
          pzinternal::DebugStopImpl(in_stack_00000260,in_stack_00000258);
        }
        TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffe50);
        pztopology::TPZTetrahedron::LowerDimensionSides
                  ((int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                   (TPZStack<int,_10> *)
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        TPZStack<int,_10>::Push
                  ((TPZStack<int,_10> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   in_stack_fffffffffffffe3c);
        local_88 = pztopology::TPZTetrahedron::NSideNodes(local_4);
        TPZManVector<long,_4>::TPZManVector
                  ((TPZManVector<long,_4> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (int64_t)in_stack_fffffffffffffe58);
        local_cc = 0;
        while( true ) {
          iVar5 = TPZVec<long>::size(local_c8);
          this = local_10;
          iVar2 = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
          if (iVar5 <= local_cc) break;
          iVar2 = pztopology::TPZTetrahedron::ContainedSideLocId
                            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
          plVar7 = TPZVec<long>::operator[](this,(long)iVar2);
          lVar1 = *plVar7;
          plVar7 = TPZVec<long>::operator[](local_c8,(long)local_cc);
          *plVar7 = lVar1;
          local_cc = local_cc + 1;
        }
        TPZGenMatrix<int>::TPZGenMatrix
                  ((TPZGenMatrix<int> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (int64_t)in_stack_fffffffffffffe58,(int64_t)in_stack_fffffffffffffe50);
        TPZShapeTriang::SideShapeOrder
                  (iVar2,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                   in_stack_fffffffffffffe58);
        for (local_ec = 0; local_ec < local_2c; local_ec = local_ec + 1) {
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          iVar2 = *piVar6;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          *piVar6 = iVar2;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          iVar2 = *piVar6;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          *piVar6 = iVar2;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          in_stack_fffffffffffffe4c = *piVar6;
          piVar6 = TPZGenMatrix<int>::operator()
                             ((TPZGenMatrix<int> *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          *piVar6 = in_stack_fffffffffffffe4c;
        }
        TPZGenMatrix<int>::~TPZGenMatrix
                  ((TPZGenMatrix<int> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        TPZManVector<long,_4>::~TPZManVector
                  ((TPZManVector<long,_4> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1897360);
      }
    }
    else {
      local_24 = in_EDX + -1;
      iVar5 = TPZGenMatrix<int>::Rows(in_RCX);
      if (iVar5 != local_24) {
        pzinternal::DebugStopImpl(in_stack_00000260,in_stack_00000258);
      }
      for (local_28 = 0; local_28 < local_14 + -1; local_28 = local_28 + 1) {
        iVar2 = local_28 + 2;
        piVar6 = TPZGenMatrix<int>::operator()
                           ((TPZGenMatrix<int> *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                            CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        *piVar6 = iVar2;
      }
    }
  }
  return;
}

Assistant:

void TPZShapeTetra::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=3)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side>=4 && side<=9)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else if (side >= 10 && side <= 13)
        {
            int nshape = (order-2)*(order-1)/2;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];
            }
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeTriang::SideShapeOrder(6,locid, order, locshapeorders);
            
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
        }
        else
        {   // interno
            int totsum = 0,sum;
            int i;
            for(i=0;i<order-3;i++) {
                sum = (i+1)*(i+2) / 2;
                totsum += sum;
            }
            int nshape = totsum;
            
            if (shapeorders.Rows() != nshape) {
                DebugStop();
            }
            int count = 0;
            int ord = order-3;
            for (int i=0;i<ord;i++) {
                for (int j=0;j<ord;j++) {
                    for (int k=0;k<ord;k++) {
                        int a = i;
                        int b = j;
                        int c = k;
                        int soma = a+b+c;
                        if( soma < ord ) { // Duvida
                            shapeorders(count,0) = 4 + soma;
                            shapeorders(count,1) = 4 + soma;
                            shapeorders(count,2) = 4 + soma;
                            count++;
                        }
                    }
                }
            }
//            int orderplus1 = order+1;
//            for (int i=4; i<orderplus1; i++)
//            {
//                for (int j=4; j<orderplus1; j++)
//                {
//                    for (int k=4; k<orderplus1; k++)
//                    {
//                        int a = i;
//                        int b = j;
//                        int c = k;
//                        int soma = a+b+c;
//                        if ((soma)<orderplus1)// Duvida
//                        {
//                            shapeorders(count,0) = soma;
//                            shapeorders(count,1) = soma;
//                            shapeorders(count,2) = soma;
//                            count++;
//                        }
//                    }
//                    
//                }
//            }

        }
    }